

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbox2d.cpp
# Opt level: O3

obb * __thiscall
masc::polygon::bbox2d::build(obb *__return_storage_ptr__,bbox2d *this,bbox2d_problem *problem)

{
  pointer pPVar1;
  pointer pPVar2;
  double dVar3;
  double dVar4;
  ulong uVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  bool bVar9;
  float fVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  ulong in_R9;
  bool bVar14;
  Vector<double,_2> *pVVar15;
  double *pdVar16;
  uint uVar17;
  uint uVar18;
  float fVar19;
  float fVar20;
  uint in_XMM3_Da;
  uint in_XMM3_Db;
  float fVar21;
  double dot;
  double dVar22;
  double dot_1;
  double dVar23;
  int e [4];
  Vector2d nev;
  Vector<double,_2> vec;
  float a [4];
  obb box;
  Vector2d local_f8;
  undefined1 local_e8 [16];
  int local_d8 [6];
  ulong local_c0;
  bbox2d_problem *local_b8;
  obb *local_b0;
  Vector<double,_2> local_a8;
  undefined1 local_98 [16];
  float local_88 [4];
  obb local_78;
  
  pPVar1 = (this->m_chull).
           super__Vector_base<mathtool::Point<double,_2>,_std::allocator<mathtool::Point<double,_2>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar13 = (ulong)((long)(this->m_chull).
                         super__Vector_base<mathtool::Point<double,_2>,_std::allocator<mathtool::Point<double,_2>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar1) >> 4;
  local_d8[0] = 0;
  dVar3 = pPVar1[1].v[1] - pPVar1->v[1];
  local_78.corners[0].v[1]._0_4_ = SUB84(dVar3,0);
  local_78.corners[0].v[0] = pPVar1[1].v[0] - pPVar1->v[0];
  local_78.corners[0].v[1]._4_4_ = (int)((ulong)dVar3 >> 0x20);
  local_b8 = problem;
  local_b0 = __return_storage_ptr__;
  mathtool::Vector<double,_2>::normalize((Vector<double,_2> *)local_e8);
  local_f8.v[0] = -(double)local_e8._8_8_;
  local_f8.v[1] = (double)local_e8._0_8_;
  local_c0 = uVar13;
  uVar11 = (uint)uVar13;
  if (2 < (int)uVar11) {
    pPVar1 = (this->m_chull).
             super__Vector_base<mathtool::Point<double,_2>,_std::allocator<mathtool::Point<double,_2>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    fVar19 = -3.4028235e+38;
    fVar20 = -3.4028235e+38;
    fVar21 = 3.4028235e+38;
    uVar13 = 2;
    do {
      dVar4 = pPVar1[uVar13].v[0] - pPVar1->v[0];
      dVar3 = pPVar1[uVar13].v[1] - pPVar1->v[1];
      dVar22 = 0.0;
      pVVar15 = (Vector<double,_2> *)local_e8;
      dVar23 = dVar4;
      bVar9 = true;
      do {
        bVar14 = bVar9;
        dVar22 = dVar22 + dVar23 * pVVar15->v[0];
        pVVar15 = (Vector<double,_2> *)(local_e8 + 8);
        dVar23 = dVar3;
        bVar9 = false;
      } while (bVar14);
      dVar23 = 0.0;
      pdVar16 = local_f8.v;
      bVar9 = true;
      do {
        bVar14 = bVar9;
        dVar23 = dVar23 + dVar4 * *pdVar16;
        pdVar16 = local_f8.v + 1;
        bVar9 = false;
        dVar4 = dVar3;
      } while (bVar14);
      uVar5 = in_R9;
      if (dVar22 < (double)fVar21) {
        uVar5 = uVar13;
      }
      in_R9 = uVar5 & 0xffffffff;
      fVar10 = (float)dVar22;
      if ((double)fVar21 <= dVar22) {
        fVar10 = fVar21;
      }
      fVar21 = fVar10;
      uVar17 = -(uint)((double)fVar19 < dVar22);
      uVar18 = -(uint)((double)fVar20 < dVar23);
      in_XMM3_Da = (uint)uVar13 & uVar17 | ~uVar17 & in_XMM3_Da;
      in_XMM3_Db = (uint)uVar13 & uVar18 | ~uVar18 & in_XMM3_Db;
      fVar19 = (float)(~uVar17 & (uint)fVar19 | (uint)(float)dVar22 & uVar17);
      fVar20 = (float)(~uVar18 & (uint)fVar20 | (uint)(float)dVar23 & uVar18);
      uVar13 = uVar13 + 1;
    } while (uVar13 != (uVar11 & 0x7fffffff));
    local_d8[3] = (int)uVar5;
    local_d8[1] = in_XMM3_Da;
    local_d8[2] = in_XMM3_Db;
  }
  uVar11 = findAngles(this,local_d8,local_88,(Vector2d *)local_e8,&local_f8);
  if ((this->m_chull).
      super__Vector_base<mathtool::Point<double,_2>,_std::allocator<mathtool::Point<double,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (this->m_chull).
      super__Vector_base<mathtool::Point<double,_2>,_std::allocator<mathtool::Point<double,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    uVar13 = 0;
    do {
      createOBB(&local_78,this,local_d8,(Vector2d *)local_e8,&local_f8);
      iVar12 = (**local_b8->_vptr_bbox2d_problem)(local_b8,&local_78);
      if ((char)iVar12 != '\0') break;
      iVar12 = (local_d8[uVar11] + 1) % (int)local_c0;
      pPVar2 = (this->m_chull).
               super__Vector_base<mathtool::Point<double,_2>,_std::allocator<mathtool::Point<double,_2>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pPVar1 = pPVar2 + iVar12;
      pPVar2 = pPVar2 + local_d8[uVar11];
      dVar3 = pPVar1->v[1] - pPVar2->v[1];
      local_98._8_4_ = SUB84(dVar3,0);
      local_98._0_8_ = pPVar1->v[0] - pPVar2->v[0];
      local_98._12_4_ = (int)((ulong)dVar3 >> 0x20);
      mathtool::Vector<double,_2>::normalize(&local_a8);
      if ((uVar11 & 1) == 0) {
        local_e8._0_8_ = local_a8.v[0];
        local_e8._8_8_ = local_a8.v[1];
        local_f8.v[0] = -local_a8.v[1];
        local_f8.v[1] = local_a8.v[0];
      }
      else {
        local_f8.v[0] = local_a8.v[0];
        local_f8.v[1] = local_a8.v[1];
        local_e8._0_8_ = -local_a8.v[1];
        local_e8._8_8_ = local_a8.v[0];
      }
      local_d8[uVar11] = iVar12;
      uVar11 = findAngles(this,local_d8,local_88,(Vector2d *)local_e8,&local_f8);
      uVar13 = uVar13 + 1;
    } while (uVar13 < (ulong)((long)(this->m_chull).
                                    super__Vector_base<mathtool::Point<double,_2>,_std::allocator<mathtool::Point<double,_2>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->m_chull).
                                    super__Vector_base<mathtool::Point<double,_2>,_std::allocator<mathtool::Point<double,_2>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 4));
  }
  dVar3 = (local_b8->m_solution).corners[0].v[0];
  dVar4 = (local_b8->m_solution).corners[0].v[1];
  dVar23 = (local_b8->m_solution).corners[1].v[0];
  dVar22 = (local_b8->m_solution).corners[1].v[1];
  dVar6 = (local_b8->m_solution).corners[2].v[0];
  dVar7 = (local_b8->m_solution).corners[2].v[1];
  dVar8 = (local_b8->m_solution).corners[3].v[1];
  local_b0->corners[3].v[0] = (local_b8->m_solution).corners[3].v[0];
  local_b0->corners[3].v[1] = dVar8;
  local_b0->corners[2].v[0] = dVar6;
  local_b0->corners[2].v[1] = dVar7;
  local_b0->corners[1].v[0] = dVar23;
  local_b0->corners[1].v[1] = dVar22;
  local_b0->corners[0].v[0] = dVar3;
  local_b0->corners[0].v[1] = dVar4;
  fVar19 = (local_b8->m_solution).height;
  local_b0->width = (local_b8->m_solution).width;
  local_b0->height = fVar19;
  return local_b0;
}

Assistant:

obb bbox2d::build(bbox2d_problem & problem)
{
  mathtool::Vector2d v,n;
  int e[4]; //vertex indices of extreme points
  float a[4]; //angles
  int w; //index (0~3), so that e[w] has the smallest value a[w]
  int hullsize=m_chull.size();

  //init extreme points
  e[0]=0;
  v=(m_chull[1]-m_chull[0]).normalize();
  n.set(-v[1],v[0]);
  const mathtool::Vector2d v0=v;

  float max_v=-FLT_MAX, min_v=FLT_MAX, max_n=-FLT_MAX;
  for(int i=2;i<hullsize;i++)
  {
    auto& pt=m_chull[i];
    double dv=(pt-m_chull[0])*v;
    double dn=(pt-m_chull[0])*n;
    if(dv>max_v){ max_v=dv; e[1]=i;}
    if(dv<min_v){ min_v=dv; e[3]=i;}
    if(dn>max_n){ max_n=dn; e[2]=i;}
  }
  w=findAngles(e,a,v,n);

  //update extreme points
  char svg_filename[256];

  for(int i=0;i<m_chull.size();i++)
  {
    //create a box from v,n,e[4]
    obb box=createOBB(e,v,n);

#if DEBUG
    cout<<"box="<<box<<endl;
    sprintf(svg_filename, "%s%03d.svg", "DEBUG_",i);
    saveSVG(svg_filename,m_chull_ply,box);
    //saveSVG(svg_filename,m_ply.front(),box);
#endif

    //check if this box solve the problem
    if(problem.solved(box)) break;

    //update
    int ne=(e[w]+1)%hullsize;
    mathtool::Vector2d nev=(m_chull[ne]-m_chull[e[w]]).normalize();
    if(w==0 || w==2)
    {
      v=nev;
      n.set(-v[1],v[0]);
    }
    else{
      n=nev;
      v.set(-n[1],n[0]);
    }
    e[w]=ne;

    w=findAngles(e,a,v,n);
  }

  return problem.getSolution(); //done
}